

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall
cmState::Directory::SetProperty(Directory *this,string *prop,char *value,cmListFileBacktrace *lfbt)

{
  int iVar1;
  PointerType pBVar2;
  size_t sVar3;
  string local_40;
  
  iVar1 = std::__cxx11::string::compare((char *)prop);
  if (iVar1 == 0) {
    if (value == (char *)0x0) {
      ClearIncludeDirectories(this);
      return;
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar3 = strlen(value);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,value,value + sVar3);
    SetIncludeDirectories(this,&local_40,lfbt);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)prop);
    if (iVar1 == 0) {
      if (value == (char *)0x0) {
        ClearCompileOptions(this);
        return;
      }
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      sVar3 = strlen(value);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,value,value + sVar3);
      SetCompileOptions(this,&local_40,lfbt);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)prop);
      if (iVar1 != 0) {
        pBVar2 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                           (&this->DirectoryState);
        cmPropertyMap::SetProperty(&pBVar2->Properties,prop,value);
        return;
      }
      if (value == (char *)0x0) {
        ClearCompileDefinitions(this);
        return;
      }
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      sVar3 = strlen(value);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,value,value + sVar3);
      SetCompileDefinitions(this,&local_40,lfbt);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmState::Directory::SetProperty(const std::string& prop,
                                     const char* value,
                                     cmListFileBacktrace lfbt)
{
  if (prop == "INCLUDE_DIRECTORIES")
    {
    if (!value)
      {
      this->ClearIncludeDirectories();
      return;
      }
    this->SetIncludeDirectories(value, lfbt);
    return;
    }
  if (prop == "COMPILE_OPTIONS")
    {
    if (!value)
      {
      this->ClearCompileOptions();
      return;
      }
    this->SetCompileOptions(value, lfbt);
    return;
    }
  if (prop == "COMPILE_DEFINITIONS")
    {
    if (!value)
      {
      this->ClearCompileDefinitions();
      return;
      }
    this->SetCompileDefinitions(value, lfbt);
    return;
    }

  this->DirectoryState->Properties.SetProperty(prop, value);
}